

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O3

int Edg_ManEvalEdgeDelay(Gia_Man_t *p)

{
  Vec_Wec_t *pVVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  size_t __size;
  uint uVar11;
  int iVar12;
  
  if ((p->vEdge1 == (Vec_Int_t *)0x0) || (p->vEdge2 == (Vec_Int_t *)0x0)) {
    __assert_fail("p->vEdge1 && p->vEdge2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                  ,0x2c0,"int Edg_ManEvalEdgeDelay(Gia_Man_t *)");
  }
  pVVar5 = p->vEdgeDelay;
  uVar10 = p->nObjs;
  if (pVVar5 == (Vec_Int_t *)0x0) {
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    uVar11 = 0x10;
    if (0xe < uVar10 - 1) {
      uVar11 = uVar10;
    }
    pVVar5->nCap = uVar11;
    if (uVar11 == 0) {
      pVVar5->pArray = (int *)0x0;
      pVVar5->nSize = uVar10;
    }
    else {
      piVar4 = (int *)malloc((long)(int)uVar11 << 2);
      pVVar5->pArray = piVar4;
      pVVar5->nSize = uVar10;
      if (piVar4 != (int *)0x0) {
        memset(piVar4,0,(long)(int)uVar10 << 2);
      }
    }
    p->vEdgeDelay = pVVar5;
  }
  else {
    if (pVVar5->nCap < (int)uVar10) {
      __size = (long)(int)uVar10 << 2;
      if (pVVar5->pArray == (int *)0x0) {
        piVar4 = (int *)malloc(__size);
      }
      else {
        piVar4 = (int *)realloc(pVVar5->pArray,__size);
      }
      pVVar5->pArray = piVar4;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar5->nCap = uVar10;
    }
    if (0 < (int)uVar10) {
      memset(pVVar5->pArray,0,(ulong)uVar10 * 4);
    }
    pVVar5->nSize = uVar10;
    uVar10 = p->nObjs;
  }
  iVar3 = 0;
  if (1 < (int)uVar10) {
    pVVar1 = p->vMapping2;
    iVar3 = 0;
    lVar6 = 1;
    do {
      if (pVVar1->nSize <= lVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar5 = pVVar1->pArray;
      uVar10 = pVVar5[lVar6].nSize;
      if ((ulong)uVar10 != 0) {
        pVVar2 = p->vEdgeDelay;
        if ((int)uVar10 < 1) {
          iVar9 = pVVar2->nSize;
          iVar7 = 0;
        }
        else {
          uVar8 = 0;
          iVar7 = 0;
          do {
            iVar12 = pVVar5[lVar6].pArray[uVar8];
            if ((((long)iVar12 < 0) || (iVar9 = pVVar2->nSize, iVar9 <= iVar12)) ||
               (p->vEdge1->nSize <= lVar6)) {
LAB_001fae2c:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar11 = 0;
            if (p->vEdge1->pArray[lVar6] != iVar12) {
              if (p->vEdge2->nSize <= lVar6) goto LAB_001fae2c;
              uVar11 = (uint)(p->vEdge2->pArray[lVar6] != iVar12);
            }
            iVar12 = uVar11 + pVVar2->pArray[iVar12];
            if (iVar7 <= iVar12) {
              iVar7 = iVar12;
            }
            uVar8 = uVar8 + 1;
          } while (uVar10 != uVar8);
        }
        if (iVar9 <= lVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        pVVar2->pArray[lVar6] = iVar7;
        if (iVar3 <= iVar7) {
          iVar3 = iVar7;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < p->nObjs);
  }
  return iVar3;
}

Assistant:

int Edg_ManEvalEdgeDelay( Gia_Man_t * p )
{
    int iLut, Delay, DelayMax = 0;
    assert( p->vEdge1 && p->vEdge2 );
    if ( p->vEdgeDelay == NULL )
        p->vEdgeDelay = Vec_IntStart( Gia_ManObjNum(p) );
    else
        Vec_IntFill( p->vEdgeDelay, Gia_ManObjNum(p), 0 );
    Gia_ManForEachLut2( p, iLut )
    {
        Delay = Edg_ObjEvalEdgeDelay(p, iLut, p->vEdgeDelay);
        Vec_IntWriteEntry( p->vEdgeDelay, iLut, Delay );
        DelayMax = Abc_MaxInt( DelayMax, Delay );
    }
    return DelayMax;
}